

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcEdgeLogLikelihoodsSecondDeriv
          (BeagleCPUImpl<double,_1,_0> *this,int parIndex,int childIndex,int probIndex,
          int firstDerivativeIndex,int secondDerivativeIndex,int categoryWeightsIndex,
          int stateFrequenciesIndex,int scalingFactorsIndex,double *outSumLogLikelihood,
          double *outSumFirstDerivative,double *outSumSecondDerivative)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  double *pdVar18;
  double **ppdVar19;
  double *pdVar20;
  double *pdVar21;
  double *pdVar22;
  double *pdVar23;
  double *pdVar24;
  int *piVar25;
  double *pdVar26;
  double *pdVar27;
  double *pdVar28;
  int iVar29;
  int iVar30;
  ulong uVar31;
  long lVar32;
  double *pdVar33;
  int iVar34;
  long lVar35;
  ulong uVar36;
  int iVar37;
  double *pdVar38;
  int iVar39;
  long lVar40;
  double __x;
  double dVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [64];
  undefined1 auVar62 [16];
  double local_b0;
  double local_90;
  
  pdVar18 = this->gPartials[parIndex];
  ppdVar19 = this->gTransitionMatrices;
  pdVar20 = ppdVar19[probIndex];
  pdVar21 = ppdVar19[firstDerivativeIndex];
  pdVar22 = ppdVar19[secondDerivativeIndex];
  pdVar23 = this->gCategoryWeights[categoryWeightsIndex];
  pdVar24 = this->gStateFrequencies[stateFrequenciesIndex];
  memset(this->integrationTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 8);
  memset(this->firstDerivTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 8);
  memset(this->secondDerivTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 8);
  if ((childIndex < this->kTipCount) &&
     (piVar25 = this->gTipStates[childIndex], piVar25 != (int *)0x0)) {
    iVar39 = this->kCategoryCount;
    if (0 < (long)iVar39) {
      uVar14 = this->kPatternCount;
      uVar15 = this->kStateCount;
      iVar16 = this->kMatrixSize;
      iVar17 = this->kPartialsPaddedStateCount;
      lVar32 = 0;
      iVar29 = 0;
      lVar35 = 0;
      do {
        if (0 < (int)uVar14) {
          auVar42._8_8_ = 0;
          auVar42._0_8_ = pdVar23[lVar32];
          pdVar33 = this->integrationTmp;
          pdVar26 = this->firstDerivTmp;
          pdVar27 = this->secondDerivTmp;
          iVar30 = this->kTransPaddedStateCount;
          lVar35 = (long)(int)lVar35;
          pdVar38 = pdVar18 + lVar35;
          uVar31 = 0;
          iVar34 = 0;
          do {
            if (0 < (int)uVar15) {
              lVar40 = (long)piVar25[uVar31] + (long)iVar29;
              uVar36 = 0;
              do {
                auVar1._8_8_ = 0;
                auVar1._0_8_ = pdVar33[(long)iVar34 + uVar36];
                auVar48._8_8_ = 0;
                auVar48._0_8_ = pdVar20[lVar40] * pdVar38[uVar36];
                auVar43 = vfmadd213sd_fma(auVar48,auVar42,auVar1);
                pdVar33[(long)iVar34 + uVar36] = auVar43._0_8_;
                auVar2._8_8_ = 0;
                auVar2._0_8_ = pdVar26[(long)iVar34 + uVar36];
                auVar49._8_8_ = 0;
                auVar49._0_8_ = pdVar21[lVar40] * pdVar38[uVar36];
                auVar43 = vfmadd213sd_fma(auVar49,auVar42,auVar2);
                pdVar26[(long)iVar34 + uVar36] = auVar43._0_8_;
                auVar3._8_8_ = 0;
                auVar3._0_8_ = pdVar27[(long)iVar34 + uVar36];
                auVar50._8_8_ = 0;
                auVar50._0_8_ = pdVar22[lVar40] * pdVar38[uVar36];
                auVar43 = vfmadd213sd_fma(auVar50,auVar42,auVar3);
                pdVar27[(long)iVar34 + uVar36] = auVar43._0_8_;
                uVar36 = uVar36 + 1;
                lVar40 = lVar40 + iVar30;
              } while (uVar15 != uVar36);
              iVar34 = iVar34 + (int)uVar36;
            }
            lVar35 = lVar35 + iVar17;
            uVar31 = uVar31 + 1;
            pdVar38 = pdVar38 + iVar17;
          } while (uVar31 != uVar14);
        }
        lVar32 = lVar32 + 1;
        iVar29 = iVar29 + iVar16;
      } while (lVar32 != iVar39);
    }
  }
  else {
    iVar39 = this->kCategoryCount;
    if (0 < (long)iVar39) {
      pdVar38 = this->gPartials[childIndex];
      iVar16 = this->kPatternCount;
      uVar14 = this->kStateCount;
      iVar17 = this->kMatrixSize;
      iVar29 = this->kPartialsPaddedStateCount;
      iVar30 = 0;
      lVar32 = 0;
      lVar35 = 0;
      do {
        if (0 < iVar16) {
          auVar43._8_8_ = 0;
          auVar43._0_8_ = pdVar23[lVar32];
          pdVar26 = this->integrationTmp;
          pdVar27 = this->firstDerivTmp;
          pdVar28 = this->secondDerivTmp;
          lVar35 = (long)(int)lVar35;
          pdVar33 = pdVar38 + lVar35;
          iVar34 = 0;
          lVar40 = 0;
          do {
            if (0 < (int)uVar14) {
              lVar40 = (long)(int)lVar40;
              uVar31 = 0;
              iVar37 = iVar30;
              do {
                auVar42 = ZEXT816(0) << 0x40;
                uVar36 = 0;
                auVar57 = ZEXT816(0) << 0x40;
                auVar52 = ZEXT816(0) << 0x40;
                do {
                  auVar62._8_8_ = 0;
                  auVar62._0_8_ = pdVar33[uVar36];
                  auVar4._8_8_ = 0;
                  auVar4._0_8_ = pdVar20[(long)iVar37 + uVar36];
                  auVar52 = vfmadd231sd_fma(auVar52,auVar62,auVar4);
                  auVar5._8_8_ = 0;
                  auVar5._0_8_ = pdVar21[(long)iVar37 + uVar36];
                  auVar57 = vfmadd231sd_fma(auVar57,auVar62,auVar5);
                  auVar6._8_8_ = 0;
                  auVar6._0_8_ = pdVar22[(long)iVar37 + uVar36];
                  auVar42 = vfmadd231sd_fma(auVar42,auVar62,auVar6);
                  uVar36 = uVar36 + 1;
                } while (uVar14 != uVar36);
                auVar7._8_8_ = 0;
                auVar7._0_8_ = pdVar26[lVar40];
                auVar60._8_8_ = 0;
                auVar60._0_8_ = auVar52._0_8_ * pdVar18[lVar35 + uVar31];
                auVar52 = vfmadd213sd_fma(auVar60,auVar43,auVar7);
                pdVar26[lVar40] = auVar52._0_8_;
                auVar52._8_8_ = 0;
                auVar52._0_8_ = pdVar27[lVar40];
                auVar58._8_8_ = 0;
                auVar58._0_8_ = auVar57._0_8_ * pdVar18[lVar35 + uVar31];
                auVar52 = vfmadd213sd_fma(auVar58,auVar43,auVar52);
                pdVar27[lVar40] = auVar52._0_8_;
                auVar57._8_8_ = 0;
                auVar57._0_8_ = pdVar28[lVar40];
                auVar51._8_8_ = 0;
                auVar51._0_8_ = auVar42._0_8_ * pdVar18[lVar35 + uVar31];
                auVar52 = vfmadd213sd_fma(auVar51,auVar43,auVar57);
                pdVar28[lVar40] = auVar52._0_8_;
                lVar40 = lVar40 + 1;
                uVar31 = uVar31 + 1;
                iVar37 = iVar37 + uVar14 + 1;
              } while (uVar31 != uVar14);
            }
            lVar35 = lVar35 + iVar29;
            iVar34 = iVar34 + 1;
            pdVar33 = pdVar33 + iVar29;
          } while (iVar34 != iVar16);
        }
        lVar32 = lVar32 + 1;
        iVar30 = iVar30 + iVar17;
      } while (lVar32 != iVar39);
    }
  }
  uVar31 = (ulong)(uint)this->kPatternCount;
  if (0 < this->kPatternCount) {
    lVar32 = 0;
    iVar39 = 0;
    do {
      iVar16 = this->kStateCount;
      if ((long)iVar16 < 1) {
        __x = 0.0;
        local_b0 = 0.0;
        local_90 = 0.0;
      }
      else {
        auVar52 = ZEXT816(0);
        lVar35 = 0;
        auVar61 = ZEXT864(0) << 0x40;
        auVar43 = ZEXT816(0);
        do {
          auVar59._8_8_ = 0;
          auVar59._0_8_ = pdVar24[lVar35];
          auVar8._8_8_ = 0;
          auVar8._0_8_ = this->integrationTmp[iVar39 + lVar35];
          auVar43 = vfmadd231sd_fma(auVar43,auVar59,auVar8);
          __x = auVar43._0_8_;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = this->firstDerivTmp[iVar39 + lVar35];
          auVar57 = vfmadd231sd_fma(auVar61._0_16_,auVar59,auVar9);
          auVar61 = ZEXT1664(auVar57);
          auVar10._8_8_ = 0;
          auVar10._0_8_ = this->secondDerivTmp[iVar39 + lVar35];
          auVar52 = vfmadd231sd_fma(auVar52,auVar59,auVar10);
          lVar35 = lVar35 + 1;
        } while (iVar16 != lVar35);
        iVar39 = iVar39 + iVar16;
        local_90 = auVar52._0_8_;
        local_b0 = auVar57._0_8_;
      }
      dVar41 = log(__x);
      this->outLogLikelihoodsTmp[lVar32] = dVar41;
      auVar44._0_8_ = local_b0 / __x;
      auVar44._8_8_ = 0;
      this->outFirstDerivativesTmp[lVar32] = auVar44._0_8_;
      auVar53._0_8_ = local_90 / __x;
      auVar53._8_8_ = 0;
      auVar43 = vfnmadd231sd_fma(auVar53,auVar44,auVar44);
      this->outSecondDerivativesTmp[lVar32] = auVar43._0_8_;
      lVar32 = lVar32 + 1;
      uVar31 = (ulong)this->kPatternCount;
    } while (lVar32 < (long)uVar31);
  }
  if ((scalingFactorsIndex != -1) && (0 < (int)uVar31)) {
    pdVar18 = this->gScaleBuffers[scalingFactorsIndex];
    pdVar20 = this->outLogLikelihoodsTmp;
    uVar36 = 0;
    do {
      pdVar20[uVar36] = pdVar18[uVar36] + pdVar20[uVar36];
      uVar36 = uVar36 + 1;
    } while ((uVar31 & 0xffffffff) != uVar36);
  }
  *outSumLogLikelihood = 0.0;
  *outSumFirstDerivative = 0.0;
  *outSumSecondDerivative = 0.0;
  if (0 < (int)uVar31) {
    pdVar18 = this->gPatternWeights;
    pdVar20 = this->outLogLikelihoodsTmp;
    pdVar21 = this->outFirstDerivativesTmp;
    pdVar22 = this->outSecondDerivativesTmp;
    uVar36 = 0;
    do {
      auVar45._8_8_ = 0;
      auVar45._0_8_ = pdVar20[uVar36];
      auVar54._8_8_ = 0;
      auVar54._0_8_ = pdVar18[uVar36];
      auVar11._8_8_ = 0;
      auVar11._0_8_ = *outSumLogLikelihood;
      auVar43 = vfmadd213sd_fma(auVar54,auVar45,auVar11);
      *outSumLogLikelihood = auVar43._0_8_;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = pdVar21[uVar36];
      auVar55._8_8_ = 0;
      auVar55._0_8_ = pdVar18[uVar36];
      auVar12._8_8_ = 0;
      auVar12._0_8_ = *outSumFirstDerivative;
      auVar43 = vfmadd213sd_fma(auVar55,auVar46,auVar12);
      *outSumFirstDerivative = auVar43._0_8_;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = pdVar22[uVar36];
      auVar56._8_8_ = 0;
      auVar56._0_8_ = pdVar18[uVar36];
      auVar13._8_8_ = 0;
      auVar13._0_8_ = *outSumSecondDerivative;
      auVar43 = vfmadd213sd_fma(auVar56,auVar47,auVar13);
      *outSumSecondDerivative = auVar43._0_8_;
      uVar36 = uVar36 + 1;
    } while ((uVar31 & 0xffffffff) != uVar36);
  }
  return (uint)(!NAN(*outSumLogLikelihood) && !NAN(*outSumLogLikelihood)) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsSecondDeriv(const int parIndex,
                                                                         const int childIndex,
                                                                         const int probIndex,
                                                                         const int firstDerivativeIndex,
                                                                         const int secondDerivativeIndex,
                                                                         const int categoryWeightsIndex,
                                                                         const int stateFrequenciesIndex,
                                                                         const int scalingFactorsIndex,
                                                                         double* outSumLogLikelihood,
                                                                         double* outSumFirstDerivative,
                                                                         double* outSumSecondDerivative) {

    assert(parIndex >= kTipCount);

    int returnCode = BEAGLE_SUCCESS;

    const REALTYPE* partialsParent = gPartials[parIndex];
    const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
    const REALTYPE* firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];
    const REALTYPE* secondDerivMatrix = gTransitionMatrices[secondDerivativeIndex];
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
    const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];


    memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));
    memset(firstDerivTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));
    memset(secondDerivTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));

    if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

        const int* statesChild = gTipStates[childIndex];
        int v = 0; // Index for parent partials

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0; // Index in resulting product-partials (summed over categories)
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {

                const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                // so we can interchange the patterCount and categoryCount loop order?
                int w =  l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    firstDerivTmp[u] += firstDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    secondDerivTmp[u] += secondDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    u++;

                    w += kTransPaddedStateCount;
                }
                v += kPartialsPaddedStateCount;
            }
        }

    } else { // Integrate against a partial at the child

        const REALTYPE* partialsChild = gPartials[childIndex];
        int v = 0;

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0;
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {
                int w = l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    double sumOverJ = 0.0;
                    double sumOverJD1 = 0.0;
                    double sumOverJD2 = 0.0;
                    for(int j = 0; j < kStateCount; j++) {
                        sumOverJ += transMatrix[w] * partialsChild[v + j];
                        sumOverJD1 += firstDerivMatrix[w] * partialsChild[v + j];
                        sumOverJD2 += secondDerivMatrix[w] * partialsChild[v + j];
                        w++;
                    }

                    // increment for the extra column at the end
                    w += T_PAD;

                    integrationTmp[u] += sumOverJ * partialsParent[v + i] * weight;
                    firstDerivTmp[u] += sumOverJD1 * partialsParent[v + i] * weight;
                    secondDerivTmp[u] += sumOverJD2 * partialsParent[v + i] * weight;
                    u++;
                }
                v += kPartialsPaddedStateCount;
            }
        }
    }

    int u = 0;
    for(int k = 0; k < kPatternCount; k++) {
        REALTYPE sumOverI = 0.0;
        REALTYPE sumOverID1 = 0.0;
        REALTYPE sumOverID2 = 0.0;
        for(int i = 0; i < kStateCount; i++) {
            sumOverI += freqs[i] * integrationTmp[u];
            sumOverID1 += freqs[i] * firstDerivTmp[u];
            sumOverID2 += freqs[i] * secondDerivTmp[u];
            u++;
        }

        outLogLikelihoodsTmp[k] = log(sumOverI);
        outFirstDerivativesTmp[k] = sumOverID1 / sumOverI;
        outSecondDerivativesTmp[k] = sumOverID2 / sumOverI - outFirstDerivativesTmp[k] * outFirstDerivativesTmp[k];
    }


    if (scalingFactorsIndex != BEAGLE_OP_NONE) {
        const REALTYPE* scalingFactors = gScaleBuffers[scalingFactorsIndex];
        for(int k=0; k < kPatternCount; k++)
            outLogLikelihoodsTmp[k] += scalingFactors[k];
    }

    *outSumLogLikelihood = 0.0;
    *outSumFirstDerivative = 0.0;
    *outSumSecondDerivative = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];

        *outSumFirstDerivative += outFirstDerivativesTmp[i] * gPatternWeights[i];

        *outSumSecondDerivative += outSecondDerivativesTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;
}